

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffbfeof(fitsfile *fptr,int *status)

{
  int local_1c;
  int ii;
  int *status_local;
  fitsfile *fptr_local;
  
  for (local_1c = 0; local_1c < 0x28; local_1c = local_1c + 1) {
    if (fptr->Fptr->filesize <= fptr->Fptr->bufrecnum[local_1c] * 0xb40) {
      fptr->Fptr->bufrecnum[local_1c] = -1;
    }
  }
  return *status;
}

Assistant:

int ffbfeof(fitsfile *fptr,        /* I - FITS file pointer           */
           int *status)           /* IO - error status               */
{
/*
  clear any buffers beyond the end of file
*/
    int ii;

    for (ii = 0; ii < NIOBUF; ii++)
    {
        if ( (LONGLONG) (fptr->Fptr)->bufrecnum[ii] * IOBUFLEN >= fptr->Fptr->filesize)
        {
            (fptr->Fptr)->bufrecnum[ii] = -1;  /* set contents of buffer as undefined */
        }
    }

    return(*status);
}